

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O3

int exception_target_el(CPUARMState_conflict *env)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar2 = 1;
      if ((env->uncached_cpsr & 0x1f) != 0x10) {
        uVar2 = env->uncached_cpsr & 0x1f;
        if (uVar2 == 0x10) {
          uVar2 = 0;
        }
        else if (uVar2 == 0x16) {
LAB_0062a439:
          uVar2 = 3;
        }
        else if (uVar2 == 0x1a) {
          uVar2 = 2;
        }
        else {
          if ((uVar1 & 0x200000000) != 0) {
            if (uVar2 == 0x16) {
              uVar2 = 3;
              if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_0062a3f0;
            }
            else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_0062a439;
          }
LAB_0062a3eb:
          uVar2 = 1;
        }
      }
    }
    else {
      if ((env->pstate & 0xc) == 0) goto LAB_0062a3eb;
      uVar2 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar2 = 1;
    if (((env->v7m).exception == 0) && (((env->v7m).control[(env->v7m).secure] & 1) == 0)) {
      uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0062a3f0:
  if ((uVar1 & 0x200000000) == 0) {
    return uVar2;
  }
  if (env->aarch64 == 0) {
    if ((env->uncached_cpsr & 0x1f) == 0x16) goto LAB_0062a424;
  }
  else if ((~env->pstate & 0xc) == 0) goto LAB_0062a424;
  if (((env->cp15).scr_el3 & 1) != 0) {
    return uVar2;
  }
LAB_0062a424:
  uVar3 = 3;
  if (uVar2 != 1) {
    uVar3 = uVar2;
  }
  if ((uVar1 & 0x10000000) == 0) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

static inline int exception_target_el(CPUARMState *env)
{
    int target_el = MAX(1, arm_current_el(env));

    /*
     * No such thing as secure EL1 if EL3 is aarch32,
     * so update the target EL to EL3 in this case.
     */
    if (arm_is_secure(env) && !arm_el_is_aa64(env, 3) && target_el == 1) {
        target_el = 3;
    }

    return target_el;
}